

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftzopen.c
# Opt level: O0

void ft_lzwstate_reset(FT_LzwState state)

{
  FT_LzwState state_local;
  
  state->in_eof = 0;
  state->buf_offset = 0;
  state->buf_size = 0;
  state->buf_clear = '\0';
  state->buf_total = 0;
  state->stack_top = 0;
  state->num_bits = 9;
  state->phase = FT_LZW_PHASE_START;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ft_lzwstate_reset( FT_LzwState  state )
  {
    state->in_eof     = 0;
    state->buf_offset = 0;
    state->buf_size   = 0;
    state->buf_clear  = 0;
    state->buf_total  = 0;
    state->stack_top  = 0;
    state->num_bits   = LZW_INIT_BITS;
    state->phase      = FT_LZW_PHASE_START;
  }